

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Copy_8_To_8(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
                uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  undefined1 uVar1;
  
  if (count != 0) {
    do {
      uVar1 = *sourceBuffer;
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride);
      *(undefined1 *)destinationBuffer = uVar1;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Copy_8_To_8(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;
                                                      
    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {
        *dest = *src;

        src += sourceStride;
        dest += destinationStride;
    }
}